

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttgxvar.c
# Opt level: O0

FT_Error TT_Vary_Apply_Glyph_Deltas(TT_Loader loader,FT_Outline *outline,FT_Vector *unrounded)

{
  ushort uVar1;
  long lVar2;
  long lVar3;
  undefined8 uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  FT_UInt16 FVar7;
  FT_UInt16 tupleIndex_00;
  FT_UInt16 FVar8;
  FT_Int32 FVar9;
  FT_Int32 FVar10;
  FT_Pointer P;
  FT_Fixed FVar11;
  FT_Fixed *P_00;
  FT_Fixed *P_01;
  long *plVar12;
  long lVar13;
  ulong uVar14;
  undefined8 *puVar15;
  FT_Int32 b;
  FT_Alloc_Func local_1a0;
  FT_UInt local_194;
  FT_UInt local_17c;
  FT_Alloc_Func local_168;
  FT_Alloc_Func local_160;
  FT_Alloc_Func local_158;
  FT_Pos point_delta_y_1;
  FT_Pos point_delta_x_1;
  FT_Fixed old_point_delta_y_1;
  FT_Fixed old_point_delta_x_1;
  FT_UShort idx;
  FT_Fixed point_delta_y;
  FT_Fixed point_delta_x;
  FT_Fixed old_point_delta_y;
  FT_Fixed old_point_delta_x;
  FT_Fixed apply;
  FT_UInt tupleIndex;
  FT_UInt tupleDataSize;
  FT_Fixed *point_deltas_y;
  FT_Fixed *point_deltas_x;
  FT_Fixed *deltas_y;
  FT_Fixed *deltas_x;
  FT_UShort *points;
  FT_UShort *localpoints;
  FT_UShort *sharedpoints;
  FT_UInt spoint_count;
  FT_UInt point_count;
  GX_Blend blend;
  FT_Fixed *im_end_coords;
  FT_Fixed *im_start_coords;
  FT_Fixed *tuple_coords;
  FT_UInt j;
  FT_UInt i;
  FT_ULong here;
  FT_ULong dataSize;
  FT_ULong offsetToData;
  long lStack_70;
  FT_UInt tupleCount;
  FT_ULong glyph_start;
  FT_Bool *has_delta;
  FT_Vector *points_out;
  FT_Vector *points_org;
  FT_UInt n_points;
  FT_UInt glyph_index;
  FT_Memory memory;
  FT_Stream stream;
  TT_Face face;
  FT_Vector *pFStack_28;
  FT_Error error;
  FT_Vector *unrounded_local;
  FT_Outline *outline_local;
  TT_Loader loader_local;
  
  stream = (FT_Stream)loader->face;
  memory = (FT_Memory)(((TT_Face)stream)->root).stream;
  _n_points = ((FT_Stream)memory)->memory;
  points_org._4_4_ = loader->glyph_index;
  points_org._0_4_ = (int)outline->n_points + 4;
  points_out = (FT_Vector *)0x0;
  has_delta = (FT_Bool *)0x0;
  glyph_start = 0;
  im_start_coords = (FT_Fixed *)0x0;
  im_end_coords = (FT_Fixed *)0x0;
  blend = (GX_Blend)0x0;
  _spoint_count = ((TT_Face)stream)->blend;
  sharedpoints._0_4_ = 0;
  localpoints = (FT_UShort *)0x0;
  points = (FT_UShort *)0x0;
  _tupleIndex = (void *)0x0;
  if ((((TT_Face)stream)->doblend == '\0') || (_spoint_count == (GX_Blend)0x0)) {
    loader_local._4_4_ = 6;
  }
  else {
    for (tuple_coords._4_4_ = 0; tuple_coords._4_4_ < (uint)points_org;
        tuple_coords._4_4_ = tuple_coords._4_4_ + 1) {
      unrounded[tuple_coords._4_4_].x = outline->points[tuple_coords._4_4_].x << 6;
      unrounded[tuple_coords._4_4_].y = outline->points[tuple_coords._4_4_].y << 6;
    }
    if ((points_org._4_4_ < _spoint_count->gv_glyphcnt) &&
       (_spoint_count->glyphoffsets[points_org._4_4_] !=
        _spoint_count->glyphoffsets[points_org._4_4_ + 1])) {
      pFStack_28 = unrounded;
      unrounded_local = (FT_Vector *)outline;
      outline_local = (FT_Outline *)loader;
      points_out = (FT_Vector *)
                   ft_mem_realloc(_n_points,0x10,0,(ulong)(uint)points_org,(void *)0x0,
                                  (FT_Error *)((long)&face + 4));
      if (((face._4_4_ == 0) &&
          (has_delta = (FT_Bool *)
                       ft_mem_realloc(_n_points,0x10,0,(ulong)(uint)points_org,(void *)0x0,
                                      (FT_Error *)((long)&face + 4)), face._4_4_ == 0)) &&
         (glyph_start = (FT_ULong)
                        ft_mem_realloc(_n_points,1,0,(ulong)(uint)points_org,(void *)0x0,
                                       (FT_Error *)((long)&face + 4)), face._4_4_ == 0)) {
        here = _spoint_count->glyphoffsets[points_org._4_4_ + 1] -
               _spoint_count->glyphoffsets[points_org._4_4_];
        face._4_4_ = FT_Stream_Seek((FT_Stream)memory,_spoint_count->glyphoffsets[points_org._4_4_])
        ;
        if ((face._4_4_ == 0) &&
           (face._4_4_ = FT_Stream_EnterFrame((FT_Stream)memory,here), face._4_4_ == 0)) {
          lStack_70 = (long)memory[2].user - (long)memory->user;
          im_start_coords =
               (FT_Fixed *)
               ft_mem_realloc(_n_points,8,0,(ulong)_spoint_count->num_axis,(void *)0x0,
                              (FT_Error *)((long)&face + 4));
          if ((face._4_4_ == 0) &&
             ((im_end_coords =
                    (FT_Fixed *)
                    ft_mem_realloc(_n_points,8,0,(ulong)_spoint_count->num_axis,(void *)0x0,
                                   (FT_Error *)((long)&face + 4)), face._4_4_ == 0 &&
              (blend = (GX_Blend)
                       ft_mem_realloc(_n_points,8,0,(ulong)_spoint_count->num_axis,(void *)0x0,
                                      (FT_Error *)((long)&face + 4)), face._4_4_ == 0)))) {
            FVar7 = FT_Stream_GetUShort((FT_Stream)memory);
            offsetToData._4_4_ = (uint)FVar7;
            FVar7 = FT_Stream_GetUShort((FT_Stream)memory);
            dataSize = (FT_ULong)FVar7;
            if ((here < dataSize) || (here < (offsetToData._4_4_ & 0xfff) << 2)) {
              face._4_4_ = 8;
            }
            else {
              dataSize = lStack_70 + dataSize;
              if ((offsetToData._4_4_ & 0x8000) != 0) {
                _j = (long)memory[2].user - (long)memory->user;
                if (dataSize < (ulong)((long)memory[2].alloc - (long)memory->user)) {
                  local_158 = (FT_Alloc_Func)((long)memory->user + dataSize);
                }
                else {
                  local_158 = memory[2].alloc;
                }
                memory[2].user = local_158;
                localpoints = ft_var_readpackedpoints
                                        ((FT_Stream)memory,_spoint_count->gvar_size,
                                         (FT_UInt *)&sharedpoints);
                dataSize = (long)memory[2].user - (long)memory->user;
                if (_j < (ulong)((long)memory[2].alloc - (long)memory->user)) {
                  local_160 = (FT_Alloc_Func)((long)memory->user + _j);
                }
                else {
                  local_160 = memory[2].alloc;
                }
                memory[2].user = local_160;
              }
              P = ft_mem_realloc(_n_points,8,0,(ulong)(uint)points_org,(void *)0x0,
                                 (FT_Error *)((long)&face + 4));
              if ((face._4_4_ == 0) &&
                 (_tupleIndex = ft_mem_realloc(_n_points,8,0,(ulong)(uint)points_org,(void *)0x0,
                                               (FT_Error *)((long)&face + 4)), face._4_4_ == 0)) {
                for (tuple_coords._0_4_ = 0; (uint)tuple_coords < (uint)points_org;
                    tuple_coords._0_4_ = (uint)tuple_coords + 1) {
                  points_out[(uint)tuple_coords].x =
                       *(long *)(unrounded_local->y + (ulong)(uint)tuple_coords * 0x10) << 0x10;
                  points_out[(uint)tuple_coords].y =
                       *(long *)(unrounded_local->y + (ulong)(uint)tuple_coords * 0x10 + 8) << 0x10;
                }
                for (tuple_coords._4_4_ = 0; tuple_coords._4_4_ < (offsetToData._4_4_ & 0xfff);
                    tuple_coords._4_4_ = tuple_coords._4_4_ + 1) {
                  FVar7 = FT_Stream_GetUShort((FT_Stream)memory);
                  tupleIndex_00 = FT_Stream_GetUShort((FT_Stream)memory);
                  if ((tupleIndex_00 & 0x8000) == 0) {
                    if (_spoint_count->tuplecount <= (tupleIndex_00 & 0xfff)) {
                      face._4_4_ = 8;
                      goto LAB_003546db;
                    }
                    memcpy(im_start_coords,
                           _spoint_count->tuplecoords +
                           (tupleIndex_00 & 0xfff) * _spoint_count->num_axis,
                           (ulong)_spoint_count->num_axis << 3);
                  }
                  else {
                    for (tuple_coords._0_4_ = 0; (uint)tuple_coords < _spoint_count->num_axis;
                        tuple_coords._0_4_ = (uint)tuple_coords + 1) {
                      FVar8 = FT_Stream_GetUShort((FT_Stream)memory);
                      im_start_coords[(uint)tuple_coords] = (long)(short)FVar8 << 2;
                    }
                  }
                  if ((tupleIndex_00 & 0x4000) != 0) {
                    for (tuple_coords._0_4_ = 0; (uint)tuple_coords < _spoint_count->num_axis;
                        tuple_coords._0_4_ = (uint)tuple_coords + 1) {
                      FVar8 = FT_Stream_GetUShort((FT_Stream)memory);
                      im_end_coords[(uint)tuple_coords] = (long)(short)FVar8 << 2;
                    }
                    for (tuple_coords._0_4_ = 0; (uint)tuple_coords < _spoint_count->num_axis;
                        tuple_coords._0_4_ = (uint)tuple_coords + 1) {
                      FVar8 = FT_Stream_GetUShort((FT_Stream)memory);
                      *(long *)(&blend->num_axis + (ulong)(uint)tuple_coords * 2) =
                           (long)(short)FVar8 << 2;
                    }
                  }
                  FVar11 = ft_var_apply_tuple(_spoint_count,tupleIndex_00,im_start_coords,
                                              im_end_coords,(FT_Fixed *)blend);
                  if (FVar11 == 0) {
                    dataSize = (uint)FVar7 + dataSize;
                  }
                  else {
                    _j = (long)memory[2].user - (long)memory->user;
                    if (dataSize < (ulong)((long)memory[2].alloc - (long)memory->user)) {
                      local_168 = (FT_Alloc_Func)((long)memory->user + dataSize);
                    }
                    else {
                      local_168 = memory[2].alloc;
                    }
                    memory[2].user = local_168;
                    if ((tupleIndex_00 & 0x2000) == 0) {
                      deltas_x = (FT_Fixed *)localpoints;
                      sharedpoints._4_4_ = (FT_UInt)sharedpoints;
                    }
                    else {
                      deltas_x = (FT_Fixed *)
                                 ft_var_readpackedpoints
                                           ((FT_Stream)memory,_spoint_count->gvar_size,
                                            (FT_UInt *)((long)&sharedpoints + 4));
                      points = (FT_UShort *)deltas_x;
                    }
                    if (sharedpoints._4_4_ == 0) {
                      local_17c = (uint)points_org;
                    }
                    else {
                      local_17c = sharedpoints._4_4_;
                    }
                    P_00 = ft_var_readpackeddeltas
                                     ((FT_Stream)memory,_spoint_count->gvar_size,local_17c);
                    if (sharedpoints._4_4_ == 0) {
                      local_194 = (uint)points_org;
                    }
                    else {
                      local_194 = sharedpoints._4_4_;
                    }
                    P_01 = ft_var_readpackeddeltas
                                     ((FT_Stream)memory,_spoint_count->gvar_size,local_194);
                    if (((deltas_x != (FT_Fixed *)0x0) && (P_01 != (FT_Fixed *)0x0)) &&
                       (P_00 != (FT_Fixed *)0x0)) {
                      b = (FT_Int32)FVar11;
                      if (deltas_x == (FT_Fixed *)0xffffffffffffffff) {
                        for (tuple_coords._0_4_ = 0; (uint)tuple_coords < (uint)points_org;
                            tuple_coords._0_4_ = (uint)tuple_coords + 1) {
                          lVar13 = *(long *)((long)P + (ulong)(uint)tuple_coords * 8);
                          lVar2 = *(long *)((long)_tupleIndex + (ulong)(uint)tuple_coords * 8);
                          FVar9 = FT_MulFix_x86_64((FT_Int32)P_00[(uint)tuple_coords],b);
                          FVar10 = FT_MulFix_x86_64((FT_Int32)P_01[(uint)tuple_coords],b);
                          *(long *)((long)P + (ulong)(uint)tuple_coords * 8) = lVar13 + FVar9;
                          *(long *)((long)_tupleIndex + (ulong)(uint)tuple_coords * 8) =
                               lVar2 + FVar10;
                        }
                      }
                      else {
                        for (tuple_coords._0_4_ = 0; (uint)tuple_coords < (uint)points_org;
                            tuple_coords._0_4_ = (uint)tuple_coords + 1) {
                          *(undefined1 *)(glyph_start + (uint)tuple_coords) = 0;
                          *(FT_Pos *)(has_delta + (ulong)(uint)tuple_coords * 0x10) =
                               points_out[(uint)tuple_coords].x;
                          *(FT_Pos *)((long)(has_delta + (ulong)(uint)tuple_coords * 0x10) + 8) =
                               points_out[(uint)tuple_coords].y;
                        }
                        for (tuple_coords._0_4_ = 0; (uint)tuple_coords < sharedpoints._4_4_;
                            tuple_coords._0_4_ = (uint)tuple_coords + 1) {
                          uVar1 = *(ushort *)((long)deltas_x + (ulong)(uint)tuple_coords * 2);
                          if (uVar1 < (uint)points_org) {
                            *(undefined1 *)(glyph_start + uVar1) = 1;
                            FVar9 = FT_MulFix_x86_64((FT_Int32)P_00[(uint)tuple_coords],b);
                            *(long *)(has_delta + (ulong)uVar1 * 0x10) =
                                 (long)FVar9 + *(long *)(has_delta + (ulong)uVar1 * 0x10);
                            FVar9 = FT_MulFix_x86_64((FT_Int32)P_01[(uint)tuple_coords],b);
                            *(long *)(has_delta + (ulong)uVar1 * 0x10 + 8) =
                                 (long)FVar9 + *(long *)(has_delta + (ulong)uVar1 * 0x10 + 8);
                          }
                        }
                        tt_interpolate_deltas
                                  ((FT_Outline *)unrounded_local,(FT_Vector *)has_delta,points_out,
                                   (FT_Bool *)glyph_start);
                        for (tuple_coords._0_4_ = 0; (uint)tuple_coords < (uint)points_org;
                            tuple_coords._0_4_ = (uint)tuple_coords + 1) {
                          lVar13 = *(long *)((long)_tupleIndex + (ulong)(uint)tuple_coords * 8);
                          lVar2 = *(long *)(has_delta + (ulong)(uint)tuple_coords * 0x10 + 8);
                          lVar3 = points_out[(uint)tuple_coords].y;
                          *(long *)((long)P + (ulong)(uint)tuple_coords * 8) =
                               *(long *)((long)P + (ulong)(uint)tuple_coords * 8) +
                               (*(long *)(has_delta + (ulong)(uint)tuple_coords * 0x10) -
                               points_out[(uint)tuple_coords].x);
                          *(long *)((long)_tupleIndex + (ulong)(uint)tuple_coords * 8) =
                               lVar13 + (lVar2 - lVar3);
                        }
                      }
                    }
                    if (points != (FT_UShort *)0xffffffffffffffff) {
                      ft_mem_free(_n_points,points);
                      points = (FT_UShort *)0x0;
                    }
                    ft_mem_free(_n_points,P_00);
                    ft_mem_free(_n_points,P_01);
                    dataSize = (uint)FVar7 + dataSize;
                    if (_j < (ulong)((long)memory[2].alloc - (long)memory->user)) {
                      local_1a0 = (FT_Alloc_Func)((long)memory->user + _j);
                    }
                    else {
                      local_1a0 = memory[2].alloc;
                    }
                    memory[2].user = local_1a0;
                  }
                }
                if (((ulong)stream[0xf].descriptor & 2) != 0) {
                  *(undefined8 *)((long)P + (ulong)((uint)points_org - 4) * 8) = 0;
                  *(undefined8 *)((long)_tupleIndex + (ulong)((uint)points_org - 4) * 8) = 0;
                  *(undefined8 *)((long)P + (ulong)((uint)points_org - 3) * 8) = 0;
                  *(undefined8 *)((long)_tupleIndex + (ulong)((uint)points_org - 3) * 8) = 0;
                }
                if (((ulong)stream[0xf].descriptor & 0x10) != 0) {
                  *(undefined8 *)((long)P + (ulong)((uint)points_org - 2) * 8) = 0;
                  *(undefined8 *)((long)_tupleIndex + (ulong)((uint)points_org - 2) * 8) = 0;
                  *(undefined8 *)((long)P + (ulong)((uint)points_org - 1) * 8) = 0;
                  *(undefined8 *)((long)_tupleIndex + (ulong)((uint)points_org - 1) * 8) = 0;
                }
                for (tuple_coords._4_4_ = 0; tuple_coords._4_4_ < (uint)points_org;
                    tuple_coords._4_4_ = tuple_coords._4_4_ + 1) {
                  pFStack_28[tuple_coords._4_4_].x =
                       (*(long *)((long)P + (ulong)tuple_coords._4_4_ * 8) + 0x200 >> 10) +
                       pFStack_28[tuple_coords._4_4_].x;
                  pFStack_28[tuple_coords._4_4_].y =
                       (*(long *)((long)_tupleIndex + (ulong)tuple_coords._4_4_ * 8) + 0x200 >> 10)
                       + pFStack_28[tuple_coords._4_4_].y;
                  plVar12 = (long *)(unrounded_local->y + (ulong)tuple_coords._4_4_ * 0x10);
                  *plVar12 = (long)(short)((ulong)(*(long *)((long)P + (ulong)tuple_coords._4_4_ * 8
                                                            ) + 0x8000) >> 0x10) + *plVar12;
                  lVar13 = unrounded_local->y + (ulong)tuple_coords._4_4_ * 0x10;
                  *(long *)(lVar13 + 8) =
                       (long)(short)((ulong)(*(long *)((long)_tupleIndex +
                                                      (ulong)tuple_coords._4_4_ * 8) + 0x8000) >>
                                    0x10) + *(long *)(lVar13 + 8);
                }
                if (((ulong)stream[0xf].descriptor & 2) == 0) {
                  puVar15 = (undefined8 *)
                            (unrounded_local->y + (ulong)((uint)points_org - 4) * 0x10);
                  *(undefined8 *)&outline_local[2].flags = *puVar15;
                  uVar4 = puVar15[1];
                  outline_local[3].n_contours = (short)uVar4;
                  outline_local[3].n_points = (short)((ulong)uVar4 >> 0x10);
                  *(int *)&outline_local[3].field_0x4 = (int)((ulong)uVar4 >> 0x20);
                  puVar15 = (undefined8 *)
                            (unrounded_local->y + (ulong)((uint)points_org - 3) * 0x10);
                  outline_local[3].points = (FT_Vector *)*puVar15;
                  outline_local[3].tags = (char *)puVar15[1];
                  uVar14 = (pFStack_28[(uint)points_org - 3].x - pFStack_28[(uint)points_org - 4].x)
                           + 0x20;
                  auVar5._8_8_ = (long)uVar14 >> 0x3f;
                  auVar5._0_8_ = uVar14 & 0xffffffffffffffc0;
                  *(int *)&outline_local[2].contours = SUB164(auVar5 / SEXT816(0x40),0);
                }
                if (((ulong)stream[0xf].descriptor & 0x10) == 0) {
                  puVar15 = (undefined8 *)
                            (unrounded_local->y + (ulong)((uint)points_org - 2) * 0x10);
                  *(undefined8 *)&outline_local[7].flags = *puVar15;
                  uVar4 = puVar15[1];
                  outline_local[8].n_contours = (short)uVar4;
                  outline_local[8].n_points = (short)((ulong)uVar4 >> 0x10);
                  *(int *)&outline_local[8].field_0x4 = (int)((ulong)uVar4 >> 0x20);
                  puVar15 = (undefined8 *)
                            (unrounded_local->y + (ulong)((uint)points_org - 1) * 0x10);
                  outline_local[8].points = (FT_Vector *)*puVar15;
                  outline_local[8].tags = (char *)puVar15[1];
                  uVar14 = (pFStack_28[(uint)points_org - 1].y - pFStack_28[(uint)points_org - 2].y)
                           + 0x20;
                  auVar6._8_8_ = (long)uVar14 >> 0x3f;
                  auVar6._0_8_ = uVar14 & 0xffffffffffffffc0;
                  *(int *)((long)&outline_local[7].contours + 4) = SUB164(auVar6 / SEXT816(0x40),0);
                }
              }
LAB_003546db:
              ft_mem_free(_n_points,P);
              ft_mem_free(_n_points,_tupleIndex);
            }
          }
          if (localpoints != (FT_UShort *)0xffffffffffffffff) {
            ft_mem_free(_n_points,localpoints);
          }
          ft_mem_free(_n_points,im_start_coords);
          im_start_coords = (FT_Fixed *)0x0;
          ft_mem_free(_n_points,im_end_coords);
          im_end_coords = (FT_Fixed *)0x0;
          ft_mem_free(_n_points,blend);
          blend = (GX_Blend)0x0;
          FT_Stream_ExitFrame((FT_Stream)memory);
        }
      }
      ft_mem_free(_n_points,points_out);
      points_out = (FT_Vector *)0x0;
      ft_mem_free(_n_points,has_delta);
      has_delta = (FT_Bool *)0x0;
      ft_mem_free(_n_points,(void *)glyph_start);
      loader_local._4_4_ = face._4_4_;
    }
    else {
      loader_local._4_4_ = 0;
    }
  }
  return loader_local._4_4_;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  TT_Vary_Apply_Glyph_Deltas( TT_Loader    loader,
                              FT_Outline*  outline,
                              FT_Vector*   unrounded )
  {
    FT_Error   error;
    TT_Face    face        = loader->face;
    FT_Stream  stream      = face->root.stream;
    FT_Memory  memory      = stream->memory;
    FT_UInt    glyph_index = loader->glyph_index;
    FT_UInt    n_points    = (FT_UInt)outline->n_points + 4;

    FT_Vector*  points_org = NULL;  /* coordinates in 16.16 format */
    FT_Vector*  points_out = NULL;  /* coordinates in 16.16 format */
    FT_Bool*    has_delta  = NULL;

    FT_ULong  glyph_start;

    FT_UInt   tupleCount;
    FT_ULong  offsetToData;
    FT_ULong  dataSize;

    FT_ULong  here;
    FT_UInt   i, j;

    FT_Fixed*  tuple_coords    = NULL;
    FT_Fixed*  im_start_coords = NULL;
    FT_Fixed*  im_end_coords   = NULL;

    GX_Blend  blend = face->blend;

    FT_UInt  point_count;
    FT_UInt  spoint_count = 0;

    FT_UShort*  sharedpoints = NULL;
    FT_UShort*  localpoints  = NULL;
    FT_UShort*  points;

    FT_Fixed*  deltas_x       = NULL;
    FT_Fixed*  deltas_y       = NULL;
    FT_Fixed*  point_deltas_x = NULL;
    FT_Fixed*  point_deltas_y = NULL;


    if ( !face->doblend || !blend )
      return FT_THROW( Invalid_Argument );

    for ( i = 0; i < n_points; i++ )
    {
      unrounded[i].x = INT_TO_F26DOT6( outline->points[i].x );
      unrounded[i].y = INT_TO_F26DOT6( outline->points[i].y );
    }

    if ( glyph_index >= blend->gv_glyphcnt      ||
         blend->glyphoffsets[glyph_index] ==
           blend->glyphoffsets[glyph_index + 1] )
    {
      FT_TRACE2(( "TT_Vary_Apply_Glyph_Deltas:"
                  " no variation data for glyph %d\n", glyph_index ));
      return FT_Err_Ok;
    }

    if ( FT_NEW_ARRAY( points_org, n_points ) ||
         FT_NEW_ARRAY( points_out, n_points ) ||
         FT_NEW_ARRAY( has_delta, n_points )  )
      goto Fail1;

    dataSize = blend->glyphoffsets[glyph_index + 1] -
                 blend->glyphoffsets[glyph_index];

    if ( FT_STREAM_SEEK( blend->glyphoffsets[glyph_index] ) ||
         FT_FRAME_ENTER( dataSize )                         )
      goto Fail1;

    glyph_start = FT_Stream_FTell( stream );

    /* each set of glyph variation data is formatted similarly to `cvar' */

    if ( FT_NEW_ARRAY( tuple_coords, blend->num_axis )    ||
         FT_NEW_ARRAY( im_start_coords, blend->num_axis ) ||
         FT_NEW_ARRAY( im_end_coords, blend->num_axis )   )
      goto Fail2;

    tupleCount   = FT_GET_USHORT();
    offsetToData = FT_GET_USHORT();

    /* rough sanity test */
    if ( offsetToData > dataSize                                ||
         ( tupleCount & GX_TC_TUPLE_COUNT_MASK ) * 4 > dataSize )
    {
      FT_TRACE2(( "TT_Vary_Apply_Glyph_Deltas:"
                  " invalid glyph variation array header\n" ));

      error = FT_THROW( Invalid_Table );
      goto Fail2;
    }

    offsetToData += glyph_start;

    if ( tupleCount & GX_TC_TUPLES_SHARE_POINT_NUMBERS )
    {
      here = FT_Stream_FTell( stream );

      FT_Stream_SeekSet( stream, offsetToData );

      sharedpoints = ft_var_readpackedpoints( stream,
                                              blend->gvar_size,
                                              &spoint_count );
      offsetToData = FT_Stream_FTell( stream );

      FT_Stream_SeekSet( stream, here );
    }

    FT_TRACE5(( "gvar: there %s %d tuple%s:\n",
                ( tupleCount & GX_TC_TUPLE_COUNT_MASK ) == 1 ? "is" : "are",
                tupleCount & GX_TC_TUPLE_COUNT_MASK,
                ( tupleCount & GX_TC_TUPLE_COUNT_MASK ) == 1 ? "" : "s" ));

    if ( FT_NEW_ARRAY( point_deltas_x, n_points ) ||
         FT_NEW_ARRAY( point_deltas_y, n_points ) )
      goto Fail3;

    for ( j = 0; j < n_points; j++ )
    {
      points_org[j].x = FT_intToFixed( outline->points[j].x );
      points_org[j].y = FT_intToFixed( outline->points[j].y );
    }

    for ( i = 0; i < ( tupleCount & GX_TC_TUPLE_COUNT_MASK ); i++ )
    {
      FT_UInt   tupleDataSize;
      FT_UInt   tupleIndex;
      FT_Fixed  apply;


      FT_TRACE6(( "  tuple %d:\n", i ));

      tupleDataSize = FT_GET_USHORT();
      tupleIndex    = FT_GET_USHORT();

      if ( tupleIndex & GX_TI_EMBEDDED_TUPLE_COORD )
      {
        for ( j = 0; j < blend->num_axis; j++ )
          tuple_coords[j] = FT_fdot14ToFixed( FT_GET_SHORT() );
      }
      else if ( ( tupleIndex & GX_TI_TUPLE_INDEX_MASK ) >= blend->tuplecount )
      {
        FT_TRACE2(( "TT_Vary_Apply_Glyph_Deltas:"
                    " invalid tuple index\n" ));

        error = FT_THROW( Invalid_Table );
        goto Fail3;
      }
      else
        FT_MEM_COPY(
          tuple_coords,
          blend->tuplecoords +
            ( tupleIndex & GX_TI_TUPLE_INDEX_MASK ) * blend->num_axis,
          blend->num_axis * sizeof ( FT_Fixed ) );

      if ( tupleIndex & GX_TI_INTERMEDIATE_TUPLE )
      {
        for ( j = 0; j < blend->num_axis; j++ )
          im_start_coords[j] = FT_fdot14ToFixed( FT_GET_SHORT() );
        for ( j = 0; j < blend->num_axis; j++ )
          im_end_coords[j] = FT_fdot14ToFixed( FT_GET_SHORT() );
      }

      apply = ft_var_apply_tuple( blend,
                                  (FT_UShort)tupleIndex,
                                  tuple_coords,
                                  im_start_coords,
                                  im_end_coords );

      if ( apply == 0 )              /* tuple isn't active for our blend */
      {
        offsetToData += tupleDataSize;
        continue;
      }

      here = FT_Stream_FTell( stream );

      FT_Stream_SeekSet( stream, offsetToData );

      if ( tupleIndex & GX_TI_PRIVATE_POINT_NUMBERS )
      {
        localpoints = ft_var_readpackedpoints( stream,
                                               blend->gvar_size,
                                               &point_count );
        points      = localpoints;
      }
      else
      {
        points      = sharedpoints;
        point_count = spoint_count;
      }

      deltas_x = ft_var_readpackeddeltas( stream,
                                          blend->gvar_size,
                                          point_count == 0 ? n_points
                                                           : point_count );
      deltas_y = ft_var_readpackeddeltas( stream,
                                          blend->gvar_size,
                                          point_count == 0 ? n_points
                                                           : point_count );

      if ( !points || !deltas_y || !deltas_x )
        ; /* failure, ignore it */

      else if ( points == ALL_POINTS )
      {
#ifdef FT_DEBUG_LEVEL_TRACE
        int  count = 0;
#endif


        FT_TRACE7(( "    point deltas:\n" ));

        /* this means that there are deltas for every point in the glyph */
        for ( j = 0; j < n_points; j++ )
        {
          FT_Fixed  old_point_delta_x = point_deltas_x[j];
          FT_Fixed  old_point_delta_y = point_deltas_y[j];

          FT_Fixed  point_delta_x = FT_MulFix( deltas_x[j], apply );
          FT_Fixed  point_delta_y = FT_MulFix( deltas_y[j], apply );


          point_deltas_x[j] = old_point_delta_x + point_delta_x;
          point_deltas_y[j] = old_point_delta_y + point_delta_y;

#ifdef FT_DEBUG_LEVEL_TRACE
          if ( point_delta_x || point_delta_y )
          {
            FT_TRACE7(( "      %d: (%f, %f) -> (%f, %f)\n",
                        j,
                        (double)( FT_intToFixed( outline->points[j].x ) +
                                    old_point_delta_x ) / 65536,
                        (double)( FT_intToFixed( outline->points[j].y ) +
                                    old_point_delta_y ) / 65536,
                        (double)( FT_intToFixed( outline->points[j].x ) +
                                    point_deltas_x[j] ) / 65536,
                        (double)( FT_intToFixed( outline->points[j].y ) +
                                    point_deltas_y[j] ) / 65536 ));
            count++;
          }
#endif
        }

#ifdef FT_DEBUG_LEVEL_TRACE
        if ( !count )
          FT_TRACE7(( "      none\n" ));
#endif
      }

      else
      {
#ifdef FT_DEBUG_LEVEL_TRACE
        int  count = 0;
#endif


        /* we have to interpolate the missing deltas similar to the */
        /* IUP bytecode instruction                                 */
        for ( j = 0; j < n_points; j++ )
        {
          has_delta[j]  = FALSE;
          points_out[j] = points_org[j];
        }

        for ( j = 0; j < point_count; j++ )
        {
          FT_UShort  idx = points[j];


          if ( idx >= n_points )
            continue;

          has_delta[idx] = TRUE;

          points_out[idx].x += FT_MulFix( deltas_x[j], apply );
          points_out[idx].y += FT_MulFix( deltas_y[j], apply );
        }

        /* no need to handle phantom points here,      */
        /* since solitary points can't be interpolated */
        tt_interpolate_deltas( outline,
                               points_out,
                               points_org,
                               has_delta );

        FT_TRACE7(( "    point deltas:\n" ));

        for ( j = 0; j < n_points; j++ )
        {
          FT_Fixed  old_point_delta_x = point_deltas_x[j];
          FT_Fixed  old_point_delta_y = point_deltas_y[j];

          FT_Pos  point_delta_x = points_out[j].x - points_org[j].x;
          FT_Pos  point_delta_y = points_out[j].y - points_org[j].y;


          point_deltas_x[j] = old_point_delta_x + point_delta_x;
          point_deltas_y[j] = old_point_delta_y + point_delta_y;

#ifdef FT_DEBUG_LEVEL_TRACE
          if ( point_delta_x || point_delta_y )
          {
            FT_TRACE7(( "      %d: (%f, %f) -> (%f, %f)\n",
                        j,
                        (double)( FT_intToFixed( outline->points[j].x ) +
                                    old_point_delta_x ) / 65536,
                        (double)( FT_intToFixed( outline->points[j].y ) +
                                    old_point_delta_y ) / 65536,
                        (double)( FT_intToFixed( outline->points[j].x ) +
                                    point_deltas_x[j] ) / 65536,
                        (double)( FT_intToFixed( outline->points[j].y ) +
                                    point_deltas_y[j] ) / 65536 ));
            count++;
          }
#endif
        }

#ifdef FT_DEBUG_LEVEL_TRACE
        if ( !count )
          FT_TRACE7(( "      none\n" ));
#endif
      }

      if ( localpoints != ALL_POINTS )
        FT_FREE( localpoints );
      FT_FREE( deltas_x );
      FT_FREE( deltas_y );

      offsetToData += tupleDataSize;

      FT_Stream_SeekSet( stream, here );
    }

    FT_TRACE5(( "\n" ));

    /* To avoid double adjustment of advance width or height, */
    /* do not move phantom points if there is HVAR or VVAR    */
    /* support, respectively.                                 */
    if ( face->variation_support & TT_FACE_FLAG_VAR_HADVANCE )
    {
      point_deltas_x[n_points - 4] = 0;
      point_deltas_y[n_points - 4] = 0;
      point_deltas_x[n_points - 3] = 0;
      point_deltas_y[n_points - 3] = 0;
    }
    if ( face->variation_support & TT_FACE_FLAG_VAR_VADVANCE )
    {
      point_deltas_x[n_points - 2] = 0;
      point_deltas_y[n_points - 2] = 0;
      point_deltas_x[n_points - 1] = 0;
      point_deltas_y[n_points - 1] = 0;
    }

    for ( i = 0; i < n_points; i++ )
    {
      unrounded[i].x += FT_fixedToFdot6( point_deltas_x[i] );
      unrounded[i].y += FT_fixedToFdot6( point_deltas_y[i] );

      outline->points[i].x += FT_fixedToInt( point_deltas_x[i] );
      outline->points[i].y += FT_fixedToInt( point_deltas_y[i] );
    }

    /* To avoid double adjustment of advance width or height, */
    /* adjust phantom points only if there is no HVAR or VVAR */
    /* support, respectively.                                 */
    if ( !( face->variation_support & TT_FACE_FLAG_VAR_HADVANCE ) )
    {
      loader->pp1      = outline->points[n_points - 4];
      loader->pp2      = outline->points[n_points - 3];
      loader->linear   = FT_PIX_ROUND( unrounded[n_points - 3].x -
                                       unrounded[n_points - 4].x ) / 64;
    }
    if ( !( face->variation_support & TT_FACE_FLAG_VAR_VADVANCE ) )
    {
      loader->pp3      = outline->points[n_points - 2];
      loader->pp4      = outline->points[n_points - 1];
      loader->vadvance = FT_PIX_ROUND( unrounded[n_points - 1].y -
                                       unrounded[n_points - 2].y ) / 64;
    }

  Fail3:
    FT_FREE( point_deltas_x );
    FT_FREE( point_deltas_y );

  Fail2:
    if ( sharedpoints != ALL_POINTS )
      FT_FREE( sharedpoints );
    FT_FREE( tuple_coords );
    FT_FREE( im_start_coords );
    FT_FREE( im_end_coords );

    FT_FRAME_EXIT();

  Fail1:
    FT_FREE( points_org );
    FT_FREE( points_out );
    FT_FREE( has_delta );

    return error;
  }